

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O2

UOConfig * __thiscall QPDFJob::UOConfig::repeat(UOConfig *this,string *parameter)

{
  _Vector_base<int,_std::allocator<int>_> local_30;
  
  if (parameter->_M_string_length != 0) {
    parseNumrange((vector<int,_std::allocator<int>_> *)&local_30,this->config->o,
                  (parameter->_M_dataplus)._M_p,0);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_30);
  }
  std::__cxx11::string::_M_assign
            ((string *)
             &((this->config->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->under_overlay->repeat_nr);
  return this;
}

Assistant:

QPDFJob::UOConfig*
QPDFJob::UOConfig::repeat(std::string const& parameter)
{
    if (!parameter.empty()) {
        config->o.parseNumrange(parameter.c_str(), 0);
    }
    config->o.m->under_overlay->repeat_nr = parameter;
    return this;
}